

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  Error EVar4;
  sbyte sVar5;
  ulong uVar6;
  long lVar7;
  uint unaff_EBX;
  uint uVar8;
  ulong uVar9;
  uint unaff_EBP;
  ZoneAllocator *size;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ZoneBitVector *unaff_R12;
  undefined8 *unaff_R14;
  undefined8 *unaff_R15;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t allocatedCapacity;
  byte local_54;
  ulong local_50;
  ZoneAllocator *local_48;
  ZoneAllocator *local_40;
  ulong local_38;
  
  if (idealCapacity < newSize) {
    _resize();
    size = allocator;
    newBitsValue = (bool)local_54;
LAB_0012b58c:
    _resize();
LAB_0012b591:
    uVar9 = (ulong)unaff_EBP;
LAB_0012b38e:
    if (0x3f < unaff_EBX + 0x3f) {
      uVar6 = 0;
      do {
        unaff_R14[uVar6] = unaff_R15[uVar6];
        uVar6 = uVar6 + 1;
      } while (unaff_EBX + 0x3f >> 6 != uVar6);
LAB_0012b3c7:
      if (*(long *)local_48 == 0) {
        _resize();
      }
      else {
        uVar10 = *(uint *)(unaff_R12 + 0xc);
        if (7 < uVar10) {
          uVar6 = (ulong)(uVar10 >> 3);
          if (uVar10 < 0x1008) {
            if (uVar10 < 0x408) {
              uVar6 = uVar6 + 0x1fffffffff >> 5;
            }
            else {
              uVar6 = (uVar6 + 0x3fffffff7f >> 6) + 4;
            }
            *unaff_R15 = *(undefined8 *)(local_48 + (uVar6 & 0xffffffff) * 8 + 8);
            *(undefined8 **)(local_48 + (uVar6 & 0xffffffff) * 8 + 8) = unaff_R15;
          }
          else {
            ZoneAllocator::_releaseDynamic(local_48,unaff_R15,uVar6);
          }
          goto LAB_0012b438;
        }
      }
      _resize();
      goto LAB_0012b5a3;
    }
    if (unaff_R15 != (undefined8 *)0x0) goto LAB_0012b3c7;
LAB_0012b438:
    *(undefined8 **)unaff_R12 = unaff_R14;
    *(int *)(unaff_R12 + 0xc) = (int)uVar9;
    size = local_40;
    uVar6 = local_50;
    unaff_R15 = unaff_R14;
  }
  else {
    uVar6 = (ulong)newSize;
    local_40 = (ZoneAllocator *)(this + 8);
    unaff_EBX = *(uint *)(this + 8);
    if (newSize <= unaff_EBX) {
      _resize();
      return 0;
    }
    unaff_R15 = *(undefined8 **)this;
    size = local_40;
    if (*(uint *)(this + 0xc) < newSize) {
      unaff_EBP = idealCapacity + 0x3f & 0xffffffc0;
      if (unaff_EBP < newSize) {
        return 1;
      }
      unaff_R12 = this;
      if (*(long *)allocator == 0) goto LAB_0012b58c;
      size = (ZoneAllocator *)(ulong)(unaff_EBP >> 3);
      unaff_R14 = (undefined8 *)ZoneAllocator::_alloc(allocator,(size_t)size,&local_38);
      if (unaff_R14 == (undefined8 *)0x0) {
        return 1;
      }
      uVar9 = local_38 * 8;
      local_50 = uVar6;
      local_48 = allocator;
      if (uVar9 < local_38) goto LAB_0012b591;
      goto LAB_0012b38e;
    }
  }
  uVar10 = unaff_EBX >> 6;
  local_48 = (ZoneAllocator *)(ulong)uVar10;
  uVar13 = (uint)uVar6;
  sVar3 = (sbyte)(uVar13 & 0x3f);
  lVar7 = -(ulong)newBitsValue;
  uVar8 = unaff_EBX & 0x3f;
  if (uVar8 != 0) {
    sVar5 = 0;
    if ((uVar10 == ((uint)(uVar6 >> 6) & 0x3ffffff)) && (sVar5 = sVar3, (uVar13 & 0x3f) <= uVar8)) {
LAB_0012b5a3:
      uVar8 = (uint)size;
      _resize();
      uVar10 = 0xcb;
      if (uVar8 < 0xcb) {
        uVar10 = uVar8;
      }
      EVar4 = String::_opString((String *)local_48,kAppend,
                                "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                         [uVar10],0xffffffffffffffff);
      return EVar4;
    }
    unaff_R15[(long)local_48] = unaff_R15[(long)local_48] | lVar7 << (sVar5 - (char)uVar8 & 0x3fU);
    uVar10 = uVar10 + 1;
  }
  auVar2 = _DAT_0014dc40;
  auVar1 = _DAT_0014dc30;
  uVar8 = uVar13 + 0x3f >> 6;
  if (uVar10 < uVar8) {
    uVar11 = (ulong)uVar10;
    lVar12 = (uVar8 - uVar11) + -1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar9 = 0;
    auVar14 = auVar14 ^ _DAT_0014dc40;
    do {
      auVar15._8_4_ = (int)uVar9;
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar15 | auVar1) ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                  auVar14._4_4_ < auVar15._4_4_) & 1)) {
        unaff_R15[uVar11 + uVar9] = lVar7;
      }
      if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
          auVar15._12_4_ <= auVar14._12_4_) {
        unaff_R15[uVar11 + uVar9 + 1] = lVar7;
      }
      uVar9 = uVar9 + 2;
    } while (((uVar8 - uVar11) + 1 & 0xfffffffffffffffe) != uVar9);
  }
  if ((uVar6 & 0x3f) != 0) {
    uVar6 = 0;
    if (newBitsValue != false) {
      uVar6 = ~(-1L << sVar3);
    }
    unaff_R15[uVar8 - 1] = uVar6;
  }
  *(uint *)size = uVar13;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}